

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O3

Status __thiscall spvtools::opt::ReplaceInvalidOpcodePass::Process(ReplaceInvalidOpcodePass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  pointer puVar2;
  bool bVar3;
  ExecutionModel model;
  FeatureManager *pFVar4;
  byte bVar5;
  Status SVar6;
  pointer puVar7;
  
  this_00 = (this->super_Pass).context_;
  pFVar4 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar4 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar4 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar3 = EnumSet<spv::Capability>::contains(&pFVar4->capabilities_,CapabilityLinkage);
  SVar6 = SuccessWithoutChange;
  if (!bVar3) {
    model = GetExecutionModel(this);
    if ((model != ExecutionModelKernel) && (model != ExecutionModelMax)) {
      pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      puVar7 = *(pointer *)
                &(pMVar1->functions_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                 ._M_impl;
      puVar2 = *(pointer *)
                ((long)&(pMVar1->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
      if (puVar7 != puVar2) {
        bVar5 = 0;
        do {
          bVar3 = RewriteFunction(this,(Function *)
                                       (puVar7->_M_t).
                                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                  ,model);
          bVar5 = bVar5 | bVar3;
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar2);
        SVar6 = bVar5 ^ SuccessWithoutChange;
      }
    }
  }
  return SVar6;
}

Assistant:

Pass::Status ReplaceInvalidOpcodePass::Process() {
  bool modified = false;

  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Linkage)) {
    return Status::SuccessWithoutChange;
  }

  spv::ExecutionModel execution_model = GetExecutionModel();
  if (execution_model == spv::ExecutionModel::Kernel) {
    // We do not handle kernels.
    return Status::SuccessWithoutChange;
  }
  if (execution_model == spv::ExecutionModel::Max) {
    // Mixed execution models for the entry points.  This case is not currently
    // handled.
    return Status::SuccessWithoutChange;
  }

  for (Function& func : *get_module()) {
    modified |= RewriteFunction(&func, execution_model);
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}